

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detector.cpp
# Opt level: O2

void __thiscall Semantic::Detector::detect(Detector *this)

{
  bool bVar1;
  __node_base *p_Var2;
  
  initDependencyGraph(this,this->symbolTable);
  bVar1 = detectCircularDependency(this);
  if (!bVar1) {
    p_Var2 = &(this->symbolTable->classes)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      detectShadowMembers(this,(Class *)p_Var2[5]._M_nxt);
    }
    calculateMemSize(this,this->symbolTable);
  }
  detectUndefinedClassFunctions(this);
  detectFreeFunctionsErrors(this);
  detectClassFunctionsErrors(this);
  return;
}

Assistant:

void Semantic::Detector::detect() {
    //If an undeclared class found while building the dependency graph, the detect function returns
    //and will not proceed with other detections.
    try { initDependencyGraph(symbolTable); }
    catch (Semantic::Err::UndeclaredClass &undeclaredClass) {
        addError(undeclaredClass.what());
        return;
    }

    bool containsCircularDependency = detectCircularDependency();

    //If contains circular dependency, shadow member function gets stuck in an infinite loop.
    if (!containsCircularDependency) {
        for (const auto &c : symbolTable->classes) {
            detectShadowMembers(c.second);
        }
    }

    if (!containsCircularDependency) calculateMemSize(symbolTable);

    detectUndefinedClassFunctions();
    detectFreeFunctionsErrors();
    detectClassFunctionsErrors();
}